

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O2

bool __thiscall
RX::match(RX *this,vector<int,_std::allocator<int>_> *start,vector<int,_std::allocator<int>_> *end,
         string *in)

{
  size_type sVar1;
  int iVar2;
  int iVar3;
  int local_4c;
  regmatch_t rm [2];
  
  if (this->_compiled == false) {
    compile(this);
  }
  sVar1 = in->_M_string_length;
  iVar3 = 0;
  while( true ) {
    iVar2 = regexec((regex_t *)&this->_regex,(in->_M_dataplus)._M_p + iVar3,2,(regmatch_t *)rm,0);
    if ((iVar2 != 0) || ((int)sVar1 <= iVar3)) break;
    local_4c = rm[0].rm_so + iVar3;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(start,&local_4c);
    local_4c = rm[0].rm_eo + iVar3;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(end,&local_4c);
    iVar3 = iVar3 + rm[0].rm_eo + (uint)(rm[0].rm_so == rm[0].rm_eo);
  }
  return (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish !=
         (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
}

Assistant:

bool RX::match (
  std::vector <int>& start,
  std::vector <int>& end,
  const std::string& in)
{
  if (!_compiled)
    compile ();

  regmatch_t rm[2];
  int offset = 0;
  int length = in.length ();
  while (regexec (&_regex, in.c_str () + offset, 2, &rm[0], 0) == 0 &&
         offset < length)
  {
    start.push_back (rm[0].rm_so + offset);
    end.push_back   (rm[0].rm_eo + offset);
    offset += rm[0].rm_eo;

    // Protection against zero-width patterns causing infinite loops.
    if (rm[0].rm_so == rm[0].rm_eo)
      ++offset;
  }

  return start.size () ? true : false;
}